

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDevice.cpp
# Opt level: O2

AdsHandle * __thiscall
AdsDevice::GetHandle
          (AdsHandle *__return_storage_ptr__,AdsDevice *this,uint32_t indexGroup,
          uint32_t indexOffset,AdsNotificationAttrib *notificationAttributes,
          PAdsNotificationFuncEx callback,uint32_t hUser)

{
  uint32_t uVar1;
  long adsErrorCode;
  pointer __p;
  AdsException *this_00;
  uint32_t local_7c;
  function<long_(unsigned_int)> local_78;
  function<long_(unsigned_int)> local_58;
  _Bind<long_(AdsDevice::*(const_AdsDevice_*,_std::_Placeholder<1>))(unsigned_int)_const> local_38;
  
  local_7c = 0;
  adsErrorCode = AdsSyncAddDeviceNotificationReqEx
                           (*(this->m_LocalPort)._M_t.
                             super___uniq_ptr_impl<const_long,_ResourceDeleter<const_long>_>._M_t.
                             super__Tuple_impl<0UL,_const_long_*,_ResourceDeleter<const_long>_>.
                             super__Head_base<0UL,_const_long_*,_false>._M_head_impl,&this->m_Addr,
                            indexGroup,indexOffset,notificationAttributes,callback,hUser,&local_7c);
  uVar1 = local_7c;
  if ((adsErrorCode == 0) && (local_7c != 0)) {
    __p = (pointer)operator_new(4);
    *__p = uVar1;
    local_38._M_f = (offset_in_AdsDevice_to_subr)DeleteNotificationHandle;
    local_38._8_8_ = 0;
    local_38._M_bound_args.super__Tuple_impl<0UL,_const_AdsDevice_*,_std::_Placeholder<1>_>.
    super__Head_base<0UL,_const_AdsDevice_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_const_AdsDevice_*,_std::_Placeholder<1>_>)
         (_Tuple_impl<0UL,_const_AdsDevice_*,_std::_Placeholder<1>_>)this;
    std::function<long(unsigned_int)>::
    function<std::_Bind<long(AdsDevice::*(AdsDevice_const*,std::_Placeholder<1>))(unsigned_int)const>,void>
              ((function<long(unsigned_int)> *)&local_78,&local_38);
    std::function<long_(unsigned_int)>::function(&local_58,&local_78);
    std::unique_ptr<unsigned_int,ResourceDeleter<unsigned_int>>::
    unique_ptr<ResourceDeleter<unsigned_int>,void>
              ((unique_ptr<unsigned_int,ResourceDeleter<unsigned_int>> *)__return_storage_ptr__,__p,
               (__enable_if_t<_is_lvalue_reference<ResourceDeleter<unsigned_int>_>::value,_ResourceDeleter<unsigned_int>_&&>
                )&local_58);
    std::_Function_base::~_Function_base(&local_58.super__Function_base);
    std::_Function_base::~_Function_base(&local_78.super__Function_base);
    return __return_storage_ptr__;
  }
  this_00 = (AdsException *)__cxa_allocate_exception(0x30);
  AdsException::AdsException(this_00,adsErrorCode);
  __cxa_throw(this_00,&AdsException::typeinfo,AdsException::~AdsException);
}

Assistant:

AdsHandle AdsDevice::GetHandle(const uint32_t               indexGroup,
                               const uint32_t               indexOffset,
                               const AdsNotificationAttrib& notificationAttributes,
                               PAdsNotificationFuncEx       callback,
                               const uint32_t               hUser) const
{
    uint32_t handle = 0;
    auto error = AdsSyncAddDeviceNotificationReqEx(
        *m_LocalPort, &m_Addr,
        indexGroup, indexOffset,
        &notificationAttributes,
        callback,
        hUser,
        &handle);
    if (error || !handle) {
        throw AdsException(error);
    }
    handle = bhf::ads::letoh(handle);
    return {new uint32_t {handle}, {std::bind(&AdsDevice::DeleteNotificationHandle, this, std::placeholders::_1)}};
}